

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall Js::InterpreterStackFrame::Process(InterpreterStackFrame *this)

{
  EHBailoutData *pEVar1;
  FunctionBody *this_00;
  code *pcVar2;
  ExecutionMode EVar3;
  bool bVar4;
  InterpreterStackFrame IVar5;
  uint uVar6;
  LocalFunctionId LVar7;
  Which WVar8;
  undefined4 *puVar9;
  Var pvVar10;
  AsmJsFunctionInfo *pAVar11;
  AsmJsModuleInfo *pAVar12;
  char16 *pcVar13;
  byte bVar14;
  EHBailoutData *ehBailoutData;
  double dVar15;
  AsmJsRetType local_98 [2];
  char16 debugStringBuffer [42];
  AutoRestore autoRestore;
  
  pEVar1 = *(EHBailoutData **)(this + 0x150);
  unique0x10000660 = this;
  if ((pEVar1 != (EHBailoutData *)0x0) && ((*(ushort *)(this + 0xd4) & 0x68) == 8)) {
    *(ushort *)(this + 0xd4) = *(ushort *)(this + 0xd4) | 0x20;
    ehBailoutData = pEVar1;
    while (ehBailoutData->parent->nestingDepth != -1) {
      ehBailoutData->parent->child = ehBailoutData;
      ehBailoutData = ehBailoutData->parent;
    }
    ProcessTryHandlerBailout(this,ehBailoutData,pEVar1->nestingDepth);
    this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] & 0xdf);
    *(undefined8 *)(this + 0x150) = 0;
  }
  this_00 = *(FunctionBody **)(this + 0x88);
  if (((this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 2) == 0) {
    this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] & 0xf7);
    *(undefined4 *)(this + 0xd8) = 0xffffffff;
    EVar3 = FunctionBody::GetInterpreterExecutionMode
                      (this_00,SUB41((*(ushort *)(this + 0xd4) & 8) >> 3,0));
    if (EVar3 == ProfilingInterpreter) {
      if (*(char *)(*(long *)(this + 0x78) + 0x143f) == '\x01') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xd8c,
                                    "(!((this->scriptContext)->ShouldPerformRecordOrReplayDebuggerAction()))"
                                    ,"We should have pinned into Interpreter mode in this case!!!");
        if (!bVar4) {
LAB_0089ab6f:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar9 = 0;
      }
      this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] & 0xef);
      pvVar10 = ProcessProfiled(this);
    }
    else {
      if (EVar3 < ProfilingInterpreter) {
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xd95,
                                    "(interpreterExecutionMode == ExecutionMode::Interpreter || interpreterExecutionMode == ExecutionMode::AutoProfilingInterpreter)"
                                    ,
                                    "interpreterExecutionMode == ExecutionMode::Interpreter || interpreterExecutionMode == ExecutionMode::AutoProfilingInterpreter"
                                   );
        if (!bVar4) goto LAB_0089ab6f;
        *puVar9 = 0;
      }
      IVar5 = (InterpreterStackFrame)
              ((byte)this[0xd6] & 0xef | (EVar3 == AutoProfilingInterpreter) << 4);
      this[0xd6] = IVar5;
      while( true ) {
        if (((byte)IVar5 & 8) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0xd9b,"(!switchProfileMode)","!switchProfileMode");
          if (!bVar4) goto LAB_0089ab6f;
          *puVar9 = 0;
        }
        pvVar10 = ProcessUnprofiled(this);
        IVar5 = this[0xd6];
        bVar14 = (byte)IVar5 & 8;
        if (pvVar10 != (Var)0x0 && bVar14 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0xdaa,"(!(switchProfileMode && result))",
                                      "!(switchProfileMode && result)");
          if (!bVar4) goto LAB_0089ab6f;
          *puVar9 = 0;
          IVar5 = this[0xd6];
          bVar14 = (byte)IVar5 & 8;
        }
        if (bVar14 == 0) break;
        this[0xd6] = (InterpreterStackFrame)((byte)IVar5 & 0xf7);
        if (((byte)IVar5 & 0x10) == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0xdb3,"(isAutoProfiling)","isAutoProfiling");
          if (!bVar4) goto LAB_0089ab6f;
          *puVar9 = 0;
        }
        uVar6 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
        LVar7 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_00);
        bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,InterpreterAutoProfilePhase,uVar6,LVar7);
        if (bVar4) {
          pcVar13 = FunctionProxy::GetDebugNumberSet
                              ((FunctionProxy *)this_00,(wchar (*) [42])local_98);
          Output::Print(L"InterpreterAutoProfile - Func %s - Started profiling\n",pcVar13);
          Output::Flush();
        }
        if (((byte)this[0xd6] & 8) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0xdbf,"(!switchProfileMode)","!switchProfileMode");
          if (!bVar4) goto LAB_0089ab6f;
          *puVar9 = 0;
        }
        pvVar10 = ProcessProfiled(this);
        IVar5 = this[0xd6];
        bVar14 = (byte)IVar5 & 8;
        if (pvVar10 != (Var)0x0 && bVar14 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0xdc1,"(!(switchProfileMode && result))",
                                      "!(switchProfileMode && result)");
          if (!bVar4) goto LAB_0089ab6f;
          *puVar9 = 0;
          IVar5 = this[0xd6];
          bVar14 = (byte)IVar5 & 8;
        }
        if (bVar14 == 0) break;
        this[0xd6] = (InterpreterStackFrame)((byte)IVar5 & 0xf7);
        if (((byte)IVar5 & 0x10) == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0xdca,"(isAutoProfiling)","isAutoProfiling");
          if (!bVar4) goto LAB_0089ab6f;
          *puVar9 = 0;
        }
        uVar6 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
        LVar7 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_00);
        bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,InterpreterAutoProfilePhase,uVar6,LVar7);
        if (bVar4) {
          pcVar13 = FunctionProxy::GetDebugNumberSet
                              ((FunctionProxy *)this_00,(wchar (*) [42])local_98);
          Output::Print(L"InterpreterAutoProfile - Func %s - Stopped profiling\n",pcVar13);
          Output::Flush();
        }
        IVar5 = this[0xd6];
      }
    }
    goto LAB_0089ab54;
  }
  pAVar11 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                      ((FunctionProxy *)this_00);
  if (pAVar11 == (AsmJsFunctionInfo *)0x0) {
    pAVar12 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)3,Js::AsmJsModuleInfo*>
                        ((FunctionProxy *)this_00);
    if (pAVar12 == (AsmJsModuleInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0xd7a,"(functionBody->GetAsmJsModuleInfo())",
                                  "functionBody->GetAsmJsModuleInfo()");
      if (!bVar4) goto LAB_0089ab6f;
      *puVar9 = 0;
    }
    pvVar10 = ProcessAsmJsModule(this);
    goto LAB_0089ab54;
  }
  AlignMemoryForAsmJs(this);
  pvVar10 = ProcessAsmJs(this);
  uVar6 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
  LVar7 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_00);
  bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,AsmjsFunctionEntryPhase,uVar6,LVar7);
  if (!bVar4) goto LAB_0089ab54;
  AsmJsCallDepth = AsmJsCallDepth - 1;
  if (AsmJsCallDepth == 0) {
    Output::Print(L"}");
  }
  else {
    Output::Print(L"%*c}",(ulong)AsmJsCallDepth,0x20);
  }
  local_98[0].which_ = (pAVar11->mReturnType).which_;
  WVar8 = AsmJsRetType::which(local_98);
  switch(WVar8) {
  case Int64:
    Output::Print(L" = %lld",**(undefined8 **)(this + 0x120));
    break;
  case Double:
    dVar15 = **(double **)(this + 0x128);
    goto LAB_0089ab1a;
  case Float:
    dVar15 = (double)**(float **)(this + 0x130);
LAB_0089ab1a:
    Output::Print(L" = %.4f",dVar15);
    break;
  case Signed:
    Output::Print(L" = %d",(ulong)**(uint **)(this + 0x118));
  }
  Output::Print(L";\n");
  Output::Flush();
LAB_0089ab54:
  Process::AutoRestore::~AutoRestore((AutoRestore *)(debugStringBuffer + 0x28));
  return pvVar10;
}

Assistant:

Var InterpreterStackFrame::Process()
    {
#if ENABLE_PROFILE_INFO
        class AutoRestore
        {
        private:
            InterpreterStackFrame * const interpreterStackFrame;
            const uint32 savedSwitchProfileModeOnLoopEndNumber;
            const bool savedIsAutoProfiling;
            const bool savedSwitchProfileMode;

        public:
            AutoRestore(InterpreterStackFrame *const interpreterStackFrame)
                : interpreterStackFrame(interpreterStackFrame),
                savedIsAutoProfiling(interpreterStackFrame->isAutoProfiling),
                savedSwitchProfileMode(interpreterStackFrame->switchProfileMode),
                savedSwitchProfileModeOnLoopEndNumber(interpreterStackFrame->switchProfileModeOnLoopEndNumber)
            {
            }

            ~AutoRestore()
            {
                interpreterStackFrame->isAutoProfiling = savedIsAutoProfiling;
                interpreterStackFrame->switchProfileMode = savedSwitchProfileMode;
                interpreterStackFrame->switchProfileModeOnLoopEndNumber = savedSwitchProfileModeOnLoopEndNumber;
            }
        } autoRestore(this);
#endif

        if (this->ehBailoutData && !this->TestFlags(InterpreterStackFrameFlags_FromBailOutInInlinee))
        {
            if (this->TestFlags(Js::InterpreterStackFrameFlags_FromBailOut) && !this->TestFlags(InterpreterStackFrameFlags_ProcessingBailOutFromEHCode))
            {
                this->OrFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutFromEHCode);
                EHBailoutData * topLevelEHBailoutData = this->ehBailoutData;
                while (topLevelEHBailoutData->parent->nestingDepth != -1)
                {
                    topLevelEHBailoutData->parent->child = topLevelEHBailoutData;
                    topLevelEHBailoutData = topLevelEHBailoutData->parent;
                }
                ProcessTryHandlerBailout(topLevelEHBailoutData, this->ehBailoutData->nestingDepth);
                this->ClearFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutFromEHCode);
                this->ehBailoutData = nullptr;
            }
        }

#ifdef ASMJS_PLAT
        if (GetFunctionBody()->GetIsAsmjsMode())
        {
            FunctionBody *const functionBody = GetFunctionBody();
            AsmJsFunctionInfo* asmInfo = functionBody->GetAsmJsFunctionInfo();
            if (asmInfo)
            {
                AlignMemoryForAsmJs();
                Var returnVar = ProcessAsmJs();
#if ENABLE_DEBUG_CONFIG_OPTIONS
                if (PHASE_TRACE(AsmjsFunctionEntryPhase, functionBody))
                {
                    --AsmJsCallDepth;
                    if (AsmJsCallDepth)
                    {
                        Output::Print(_u("%*c}"), AsmJsCallDepth, ' ');
                    }
                    else
                    {
                        Output::Print(_u("}"));
                    }
                    switch (asmInfo->GetReturnType().which())
                    {
                    case AsmJsRetType::Void:
                        break;
                    case AsmJsRetType::Signed:
                        Output::Print(_u(" = %d"), m_localIntSlots[0]);
                        break;
                    case AsmJsRetType::Int64:
                        Output::Print(_u(" = %lld"), m_localInt64Slots[0]);
                        break;
                    case AsmJsRetType::Float:
                        Output::Print(_u(" = %.4f"), m_localFloatSlots[0]);
                        break;
                    case AsmJsRetType::Double:
                        Output::Print(_u(" = %.4f"), m_localDoubleSlots[0]);
                        break;
                    default:
                        break;
                    }
                    Output::Print(_u(";\n"));
                    Output::Flush();
                }
#endif
                return returnVar;
            }
            else
            {
                Assert(functionBody->GetAsmJsModuleInfo());
                return ProcessAsmJsModule();
            }
        }
#endif

#if ENABLE_PROFILE_INFO
        switchProfileMode = false;
        switchProfileModeOnLoopEndNumber = 0u - 1;
#endif

#if ENABLE_PROFILE_INFO
        FunctionBody *const functionBody = GetFunctionBody();
        const ExecutionMode interpreterExecutionMode =
            functionBody->GetInterpreterExecutionMode(TestFlags(InterpreterStackFrameFlags_FromBailOut));
        if (interpreterExecutionMode == ExecutionMode::ProfilingInterpreter)
        {
#if ENABLE_TTD
            AssertMsg(!SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext), "We should have pinned into Interpreter mode in this case!!!");
#endif

            isAutoProfiling = false;
            return ProcessProfiled();
        }

        Assert(
            interpreterExecutionMode == ExecutionMode::Interpreter ||
            interpreterExecutionMode == ExecutionMode::AutoProfilingInterpreter);
        isAutoProfiling = interpreterExecutionMode == ExecutionMode::AutoProfilingInterpreter;

        Var result;
        while (true)
        {
            Assert(!switchProfileMode);

#if ENABLE_TTD_DIAGNOSTICS_TRACING
            if (this->scriptContext->ShouldPerformRecordOrReplayAction())
            {
                result = ProcessUnprofiled_PreviousStmtTracking();
            }
            else
            {
                result = ProcessUnprofiled();
            }
#else
            result = ProcessUnprofiled();
#endif

            Assert(!(switchProfileMode && result));
            if (switchProfileMode)
            {
                switchProfileMode = false;
            }
            else
            {
                break;
            }
            Assert(isAutoProfiling);

#if DBG_DUMP

            if (PHASE_TRACE(InterpreterAutoProfilePhase, functionBody))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("InterpreterAutoProfile - Func %s - Started profiling\n"), functionBody->GetDebugNumberSet(debugStringBuffer));
                Output::Flush();
            }
#endif

            Assert(!switchProfileMode);
            result = ProcessProfiled();
            Assert(!(switchProfileMode && result));
            if (switchProfileMode)
            {
                switchProfileMode = false;
            }
            else
            {
                break;
            }
            Assert(isAutoProfiling);

#if DBG_DUMP
            if (PHASE_TRACE(InterpreterAutoProfilePhase, functionBody))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("InterpreterAutoProfile - Func %s - Stopped profiling\n"), functionBody->GetDebugNumberSet(debugStringBuffer));
                Output::Flush();
            }
#endif
        }
        return result;
#else
#if ENABLE_TTD_DIAGNOSTICS_TRACING
        if (this->scriptContext->ShouldPerformRecordOrReplayAction())
        {
            return ProcessUnprofiled_PreviousStmtTracking();
        }
        else
        {
            return ProcessUnprofiled();
        }
#else
        return ProcessUnprofiled();
#endif
#endif
    }